

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ExtensionSet::Extension::Free(Extension *this)

{
  bool bVar1;
  CppType CVar2;
  string *this_00;
  
  bVar1 = this->is_repeated;
  CVar2 = anon_unknown_22::cpp_type(this->type);
  if (bVar1 == true) {
    switch(CVar2) {
    case CPPTYPE_INT32:
    case CPPTYPE_ENUM:
      this_00 = (string *)(this->field_0).repeated_int32_value;
      if (this_00 != (string *)0x0) {
        RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_00);
      }
      break;
    case CPPTYPE_INT64:
      this_00 = (string *)(this->field_0).repeated_int64_value;
      if (this_00 != (string *)0x0) {
        RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_00);
      }
      break;
    case CPPTYPE_UINT32:
      this_00 = (string *)(this->field_0).repeated_uint32_value;
      if (this_00 != (string *)0x0) {
        RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_00);
      }
      break;
    case CPPTYPE_UINT64:
      this_00 = (string *)(this->field_0).repeated_uint64_value;
      if (this_00 != (string *)0x0) {
        RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_00);
      }
      break;
    case CPPTYPE_DOUBLE:
      this_00 = (string *)(this->field_0).repeated_double_value;
      if (this_00 != (string *)0x0) {
        RepeatedField<double>::~RepeatedField((RepeatedField<double> *)this_00);
      }
      break;
    case CPPTYPE_FLOAT:
      this_00 = (string *)(this->field_0).repeated_float_value;
      if (this_00 != (string *)0x0) {
        RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_00);
      }
      break;
    case CPPTYPE_BOOL:
      this_00 = (string *)(this->field_0).repeated_bool_value;
      if (this_00 != (string *)0x0) {
        RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_00);
      }
      break;
    case CPPTYPE_STRING:
      this_00 = (string *)(this->field_0).repeated_string_value;
      if (this_00 != (string *)0x0) {
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)this_00);
      }
      break;
    case CPPTYPE_MESSAGE:
      this_00 = (string *)(this->field_0).repeated_message_value;
      if (this_00 != (string *)0x0) {
        RepeatedPtrField<google::protobuf::MessageLite>::~RepeatedPtrField
                  ((RepeatedPtrField<google::protobuf::MessageLite> *)this_00);
      }
      break;
    default:
      goto switchD_0026c502_default;
    }
LAB_0026c5ed:
    operator_delete(this_00);
    return;
  }
  if (CVar2 == CPPTYPE_MESSAGE) {
    if ((this->field_0).repeated_string_value !=
        (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0) {
      (*(code *)(((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_)->
                impl_).hint_._M_b._M_p)();
      return;
    }
  }
  else if (CVar2 == CPPTYPE_STRING) {
    this_00 = (this->field_0).string_value;
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string((string *)this_00);
    }
    goto LAB_0026c5ed;
  }
switchD_0026c502_default:
  return;
}

Assistant:

void ExtensionSet::Extension::Free() {
  if (is_repeated) {
    switch (cpp_type(type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)   \
  case WireFormatLite::CPPTYPE_##UPPERCASE: \
    delete repeated_##LOWERCASE##_value;    \
    break

      HANDLE_TYPE(INT32, int32);
      HANDLE_TYPE(INT64, int64);
      HANDLE_TYPE(UINT32, uint32);
      HANDLE_TYPE(UINT64, uint64);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, enum);
      HANDLE_TYPE(STRING, string);
      HANDLE_TYPE(MESSAGE, message);
#undef HANDLE_TYPE
    }
  } else {
    switch (cpp_type(type)) {
      case WireFormatLite::CPPTYPE_STRING:
        delete string_value;
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        if (is_lazy) {
          delete lazymessage_value;
        } else {
          delete message_value;
        }
        break;
      default:
        break;
    }
  }
}